

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O1

void __thiscall
btSliderConstraint::getInfo2NonVirtual
          (btSliderConstraint *this,btConstraintInfo2 *info,btTransform *transA,btTransform *transB,
          btVector3 *linVelA,btVector3 *linVelB,btScalar rbAinvMass,btScalar rbBinvMass)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  btScalar *pbVar5;
  btRigidBody *pbVar6;
  btRigidBody *pbVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  btScalar *pbVar12;
  char cVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  btScalar *pbVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  btScalar bVar25;
  float in_XMM0_Db;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar26;
  float in_XMM1_Db;
  float fVar27;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  btScalar bVar45;
  float fVar46;
  undefined1 local_190 [4];
  undefined8 uStack_18c;
  undefined4 uStack_184;
  float local_180;
  float local_17c;
  undefined1 local_178 [8];
  float fStack_170;
  undefined4 uStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [12];
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  float local_128;
  float fStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f0;
  float local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  btVector3 *local_40;
  btVector3 *local_38;
  
  uStack_16c = local_178._4_4_;
  iVar16 = info->rowskip;
  fVar39 = 0.0;
  uVar40 = 0;
  uVar41 = 0;
  fVar31 = 1.0;
  if (this->m_useLinearReferenceFrameA == false) {
    fVar31 = -1.0;
  }
  local_17c = (this->m_calculatedTransformB).m_origin.m_floats[0] -
              (this->m_calculatedTransformA).m_origin.m_floats[0];
  local_ec = (this->m_calculatedTransformB).m_origin.m_floats[1] -
             (this->m_calculatedTransformA).m_origin.m_floats[1];
  local_180 = (this->m_calculatedTransformB).m_origin.m_floats[2] -
              (this->m_calculatedTransformA).m_origin.m_floats[2];
  uVar19 = -(uint)(rbBinvMass < 1.1920929e-07);
  iVar21 = -(uint)(in_XMM1_Dc < 0.0);
  iVar22 = -(uint)(in_XMM1_Dd < 0.0);
  auVar35._4_4_ = -(uint)(in_XMM0_Db < 0.0);
  auVar35._0_4_ = -(uint)(rbAinvMass < 1.1920929e-07);
  auVar35._8_4_ = -(uint)(in_XMM0_Dc < 0.0);
  auVar35._12_4_ = -(uint)(in_XMM0_Dd < 0.0);
  uVar20 = -(uint)(0.0 < rbAinvMass + rbBinvMass);
  local_128 = (float)(~uVar20 & 0x3f000000 | (uint)(rbBinvMass / (rbAinvMass + rbBinvMass)) & uVar20
                     );
  fVar38 = 1.0 - local_128;
  local_168 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[0];
  fStack_164 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
  fVar44 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
  fVar24 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[0];
  fVar26 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[0];
  local_68 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[0];
  fStack_124 = 0.0;
  uStack_120 = 0;
  uStack_11c = 0;
  _local_158 = ZEXT416((uint)fStack_164);
  local_40 = linVelA;
  local_38 = linVelB;
  if (this->m_useOffsetForConstraintFrame == true) {
    fVar29 = fVar24 * fVar38 + local_168 * local_128;
    fStack_164 = fVar26 * fVar38 + fStack_164 * local_128;
    fStack_160 = fVar38 * 0.0 + local_128 * 0.0;
    fStack_15c = fVar38 * 0.0 + local_128 * 0.0;
    fVar39 = fVar38 * local_68 + local_128 * fVar44;
    fVar23 = fVar39 * fVar39 + fVar29 * fVar29 + fStack_164 * fStack_164;
    _local_98 = ZEXT416((uint)fVar38);
    _local_118 = ZEXT416((uint)local_168);
    _local_a8 = ZEXT416((uint)fVar44);
    _local_c8 = ZEXT416((uint)fVar24);
    _local_d8 = ZEXT416((uint)fVar26);
    local_e8 = CONCAT44(-(uint)(in_XMM1_Db < 0.0),uVar19);
    uStack_e0 = CONCAT44(iVar22,iVar21);
    local_168 = fVar29;
    _local_b8 = auVar35;
    if (fVar23 < 0.0) {
      fStack_104 = 0.0;
      fStack_100 = 0.0;
      fStack_fc = 0.0;
      local_108 = fVar39;
      fVar23 = sqrtf(fVar23);
      fVar39 = local_108;
      fVar44 = fStack_104;
      fVar24 = fStack_100;
      fVar26 = fStack_fc;
    }
    else {
      fVar23 = SQRT(fVar23);
      fVar44 = 0.0;
      fVar24 = 0.0;
      fVar26 = 0.0;
    }
    fVar23 = 1.0 / fVar23;
    fVar39 = fVar39 * fVar23;
    local_168 = local_168 * fVar23;
    fStack_164 = fStack_164 * fVar23;
    fStack_160 = fStack_160 * fVar23;
    fStack_15c = fStack_15c * fVar23;
    local_138 = ZEXT416((uint)fVar39);
    if (ABS(fVar39) <= 0.70710677) {
      fVar38 = local_168 * local_168 + fStack_164 * fStack_164;
      if (fVar38 < 0.0) {
        local_108 = fVar39;
        fStack_104 = fVar44;
        fStack_100 = fVar24;
        fStack_fc = fVar26;
        local_88 = fVar38;
        fStack_84 = fStack_164;
        fStack_80 = fStack_160;
        fStack_7c = fStack_15c;
        fVar44 = sqrtf(fVar38);
        fVar38 = local_88;
        fVar39 = local_108;
      }
      else {
        fVar44 = SQRT(fVar38);
      }
      fVar44 = 1.0 / fVar44;
      uStack_18c._4_4_ = 0.0;
      uStack_18c._0_4_ = fVar44 * local_168;
      local_190 = (undefined1  [4])(fVar44 * -fStack_164);
      local_178._4_4_ = fVar39 * fVar44 * -fStack_164;
      local_178._0_4_ = -fVar39 * fVar44 * local_168;
      fStack_170 = fVar38 * fVar44;
      auVar35 = _local_b8;
      fVar24 = (float)local_c8._0_4_;
      fVar26 = (float)local_d8._0_4_;
      fVar38 = (float)local_98._0_4_;
      fVar39 = (float)local_98._4_4_;
      uVar40 = uStack_90;
      uVar41 = uStack_8c;
      fVar23 = (float)local_118._0_4_;
      uVar19 = (uint)local_e8;
      iVar21 = (int)(float)uStack_e0;
      iVar22 = uStack_e0._4_4_;
      fVar44 = (float)local_a8._0_4_;
    }
    else {
      fVar38 = fStack_164 * fStack_164 + fVar39 * fVar39;
      if (fVar38 < 0.0) {
        local_108 = fVar39;
        fStack_104 = fVar44;
        fStack_100 = fVar24;
        fStack_fc = fVar26;
        local_88 = fStack_164;
        fStack_84 = fStack_164;
        fStack_80 = fStack_164;
        fStack_7c = fStack_164;
        local_58 = fVar38;
        fStack_54 = fStack_164;
        fStack_50 = fStack_164;
        fStack_4c = fStack_164;
        fVar24 = sqrtf(fVar38);
        fVar44 = local_88;
        fVar38 = local_58;
        fVar39 = local_108;
      }
      else {
        fVar24 = SQRT(fVar38);
        fVar44 = fStack_164;
      }
      fVar24 = 1.0 / fVar24;
      auVar11._4_4_ = fVar44 * fVar24;
      auVar11._0_4_ = -fVar39 * fVar24;
      auVar11._8_4_ = uStack_184;
      auVar11._12_4_ = 0;
      _local_190 = auVar11 << 0x20;
      local_178._4_4_ = fVar44 * fVar24 * -local_168;
      local_178._0_4_ = fVar24 * fVar38;
      fStack_170 = -fVar39 * fVar24 * local_168;
      auVar35 = _local_b8;
      fVar24 = (float)local_c8._0_4_;
      fVar26 = (float)local_d8._0_4_;
      fVar38 = (float)local_98._0_4_;
      fVar39 = (float)local_98._4_4_;
      uVar40 = uStack_90;
      uVar41 = uStack_8c;
      fVar23 = (float)local_118._0_4_;
      uVar19 = (uint)local_e8;
      iVar21 = (int)(float)uStack_e0;
      iVar22 = uStack_e0._4_4_;
      fVar44 = (float)local_a8._0_4_;
    }
  }
  else {
    local_138 = ZEXT416((uint)fVar44);
    uStack_18c._0_4_ = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
    local_190 = (undefined1  [4])
                (int)*(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[0].m_floats + 1);
    uStack_18c._4_4_ = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
    uStack_184 = 0;
    fStack_160 = 0.0;
    fStack_15c = 0.0;
    local_178._4_4_ = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
    local_178._0_4_ =
         (int)*(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[0].m_floats + 2);
    fStack_170 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
    uStack_16c = 0;
    fVar23 = local_168;
    local_158._0_4_ = fStack_164;
  }
  auVar9._4_4_ = 0;
  auVar9._0_4_ = uVar19;
  auVar9._8_4_ = iVar21;
  auVar9._12_4_ = iVar22;
  pbVar12 = info->m_J1angularAxis;
  *pbVar12 = (btScalar)local_190;
  fVar32 = local_190._4_4_;
  fVar33 = local_190._8_4_;
  *(ulong *)(pbVar12 + 1) = uStack_18c;
  pbVar12[iVar16] = (btScalar)local_178._0_4_;
  fVar28 = local_178._4_4_;
  fVar27 = local_178._8_4_;
  pbVar12[(long)iVar16 + 1] = fVar28;
  pbVar12[(long)iVar16 + 2] = fVar27;
  pbVar17 = info->m_J2angularAxis;
  *pbVar17 = -(float)local_190;
  *(ulong *)(pbVar17 + 1) = uStack_18c ^ 0x8000000080000000;
  pbVar17[iVar16] = -(float)local_178._0_4_;
  pbVar17[(long)iVar16 + 1] = -fVar28;
  pbVar17[(long)iVar16 + 2] = -fVar27;
  uVar19 = this->m_flags;
  fVar29 = this->m_softnessOrthoAng;
  if (-1 < (char)uVar19) {
    fVar29 = fVar29 * info->erp;
  }
  fVar29 = fVar29 * info->fps;
  fVar30 = (float)local_158._0_4_ * local_68 - fVar26 * fVar44;
  fVar46 = fVar44 * fVar24 - local_68 * fVar23;
  fVar44 = fVar23 * fVar26 - fVar24 * (float)local_158._0_4_;
  pbVar5 = info->m_constraintError;
  *pbVar5 = (fVar33 * fVar44 + fVar30 * (float)local_190 + fVar46 * fVar32) * fVar29;
  pbVar5[iVar16] = (fVar44 * fVar27 + fVar30 * (float)local_178._0_4_ + fVar46 * fVar28) * fVar29;
  if ((uVar19 & 0x40) != 0) {
    pbVar5 = info->cfm;
    *pbVar5 = this->m_cfmOrthoAng;
    pbVar5[iVar16] = this->m_cfmOrthoAng;
  }
  fVar44 = (transA->m_origin).m_floats[0];
  uVar1 = *(undefined8 *)((transA->m_origin).m_floats + 1);
  fVar24 = (transB->m_origin).m_floats[0];
  uVar2 = *(undefined8 *)((transB->m_origin).m_floats + 1);
  fVar23 = (float)uVar2;
  fVar29 = (float)((ulong)uVar2 >> 0x20);
  local_148 = ZEXT816(0);
  lVar15 = (long)(iVar16 * 2);
  lVar18 = (long)(iVar16 * 3);
  fVar26 = (float)uVar1;
  fVar30 = (float)((ulong)uVar1 >> 0x20);
  if (this->m_useOffsetForConstraintFrame == true) {
    fVar28 = this->m_linPos - (this->m_depth).m_floats[0];
    uVar1 = *(undefined8 *)((this->m_calculatedTransformA).m_origin.m_floats + 1);
    fVar26 = (float)uVar1 - fVar26;
    fVar30 = (float)((ulong)uVar1 >> 0x20) - fVar30;
    uVar1 = *(undefined8 *)((this->m_calculatedTransformB).m_origin.m_floats + 1);
    fVar23 = (float)uVar1 - fVar23;
    fVar29 = (float)((ulong)uVar1 >> 0x20) - fVar29;
    fVar24 = (this->m_calculatedTransformB).m_origin.m_floats[0] - fVar24;
    fVar44 = (this->m_calculatedTransformA).m_origin.m_floats[0] - fVar44;
    fVar42 = (this->m_calculatedTransformB).m_origin.m_floats[2] - 0.0;
    fVar43 = (this->m_calculatedTransformB).m_origin.m_floats[3] - 0.0;
    local_a8._4_4_ = fStack_164;
    local_a8._0_4_ = fStack_164;
    fStack_a0 = fStack_164;
    fStack_9c = fStack_164;
    fVar36 = (float)local_138._0_4_ * fVar29 + fVar24 * local_168 + fVar23 * fStack_164;
    fVar37 = (float)local_138._0_4_ * fVar30 + fVar44 * local_168 + fVar26 * fStack_164;
    fVar26 = fVar26 - fVar37 * fStack_164;
    fVar27 = fVar30 - fVar37 * (float)local_138._0_4_;
    fVar24 = fVar24 - local_168 * fVar36;
    local_118._4_4_ = fVar44 - local_168 * fVar37;
    fVar42 = fVar42 - local_168 *
                      ((float)local_138._0_4_ * 0.0 + fVar42 * local_168 + fVar29 * fStack_164);
    fVar43 = fVar43 - local_168 *
                      ((float)local_138._0_4_ * 0.0 + fVar43 * local_168 + fVar30 * fStack_164);
    local_b8._4_4_ = local_138._0_4_;
    local_b8._0_4_ = fStack_164;
    fStack_b0 = fStack_160;
    fStack_ac = fStack_15c;
    fVar23 = fVar23 - fVar36 * fStack_164;
    fVar29 = fVar29 - fVar36 * (float)local_138._0_4_;
    fVar44 = (local_168 * fVar37 + local_168 * fVar28) - local_168 * fVar36;
    fVar32 = (fVar37 * fStack_164 + fVar28 * fStack_164) - fVar36 * fStack_164;
    fVar33 = (fVar37 * (float)local_138._0_4_ + fVar28 * (float)local_138._0_4_) -
             fVar36 * (float)local_138._0_4_;
    fVar46 = (fVar37 * fStack_160 + fVar28 * fStack_160) - fVar36 * fStack_160;
    fVar34 = (fVar37 * fStack_15c + fVar28 * fStack_15c) - fVar36 * fStack_15c;
    local_c8._4_4_ = local_128;
    local_c8._0_4_ = local_128;
    fStack_c0 = local_128;
    fStack_bc = local_128;
    fVar28 = (float)local_118._4_4_ + local_128 * fVar44;
    local_118._0_4_ = fVar28;
    fStack_110 = (float)local_118._4_4_;
    fStack_10c = (float)local_118._4_4_;
    local_d8._4_4_ = fVar38;
    local_d8._0_4_ = fVar38;
    fStack_d0 = fVar38;
    fStack_cc = fVar38;
    local_68 = fVar23 - fVar32 * fVar38;
    fStack_64 = fVar29 - fVar33 * fVar38;
    fStack_60 = (0.0 - fVar36 * fStack_160) - fVar46 * fVar38;
    fStack_5c = (0.0 - fVar36 * fStack_15c) - fVar34 * fVar38;
    fVar30 = fVar38 * (float)local_118._4_4_;
    fVar44 = fVar24 - fVar44 * fVar38;
    fVar24 = fVar30 + local_128 * fVar24;
    fVar23 = fVar38 * fVar26 + local_128 * fVar23;
    fVar26 = local_128 * fVar32 + fVar26;
    fVar32 = local_128 * fVar33 + fVar27;
    fVar29 = fVar27 * fVar38 + fVar29 * local_128;
    uStack_18c._0_4_ = fVar23;
    local_190 = (undefined1  [4])fVar24;
    uStack_18c._4_4_ = fVar29;
    uStack_184 = 0;
    fVar33 = fVar29 * fVar29 + fVar24 * fVar24 + fVar23 * fVar23;
    auVar10._4_4_ = local_68;
    auVar10._0_4_ = fStack_64;
    auVar10._8_8_ = 0;
    _local_158 = auVar10 << 0x40;
    fVar27 = fVar32;
    if (fVar33 <= 1.1920929e-07) {
      uStack_18c._0_4_ = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
      local_190 = (undefined1  [4])
                  (int)*(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[0].m_floats + 1);
      uStack_18c._4_4_ = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
      uStack_184 = 0;
    }
    else {
      if (fVar33 < 0.0) {
        local_98._4_4_ = fVar39;
        local_98._0_4_ = fVar38;
        uStack_90 = uVar40;
        uStack_8c = uVar41;
        uStack_e0 = CONCAT44(fVar26,fVar32);
        local_e8 = 0;
        local_108 = fVar44;
        fStack_104 = (float)local_118._4_4_;
        fStack_100 = fVar42;
        fStack_fc = fVar43;
        local_f0 = fVar29;
        local_88 = fVar26;
        fStack_84 = fVar32;
        fStack_80 = local_128 * fVar46 + (0.0 - fVar37 * fStack_160);
        fStack_7c = local_128 * fVar34 + (0.0 - fVar37 * fStack_15c);
        local_58 = fVar24;
        fStack_54 = fVar23;
        fStack_50 = fVar30 + fStack_124 * fVar42;
        fStack_4c = fVar30 + fVar39 * fVar43;
        fVar33 = sqrtf(fVar33);
        fVar24 = local_58;
        fVar23 = fStack_54;
        fVar26 = local_88;
        fVar32 = fStack_84;
        fVar38 = (float)local_98._0_4_;
        fVar44 = local_108;
        fVar28 = (float)local_118._0_4_;
        fVar27 = (float)uStack_e0;
        fVar29 = local_f0;
      }
      else {
        fVar33 = SQRT(fVar33);
        uStack_184 = 0;
      }
      fVar33 = 1.0 / fVar33;
      uStack_18c._0_4_ = fVar23 * fVar33;
      local_190 = (undefined1  [4])(fVar24 * fVar33);
      uStack_18c._4_4_ = fVar29 * fVar33;
    }
    fVar24 = local_190._4_4_;
    fVar23 = local_190._8_4_;
    fVar29 = (float)local_b8._0_4_ * fVar23 - (float)local_138._0_4_ * fVar24;
    fVar33 = (float)local_b8._4_4_ * (float)local_190 - local_168 * fVar23;
    fVar39 = local_168 * fVar24 - (float)local_a8._0_4_ * (float)local_190;
    fStack_170 = fVar39;
    local_178 = (undefined1  [8])CONCAT44(fVar33,fVar29);
    uStack_16c = 0;
    local_148._4_4_ = (float)local_190 * fStack_64 - fVar23 * fVar44;
    local_148._0_4_ = fVar23 * local_68 - fVar24 * fStack_64;
    local_148._8_4_ = fVar44 * fVar24 - (float)local_190 * local_68;
    local_148._12_4_ = 0;
    local_158._4_4_ = local_158._0_4_;
    local_158._0_4_ = local_158._8_4_;
    local_158._8_4_ = fStack_60;
    fStack_14c = fStack_5c;
    pbVar12 = info->m_J1angularAxis;
    *(ulong *)(pbVar12 + lVar15) =
         CONCAT44(fVar32 * (float)local_190 - fVar23 * fVar28,fVar26 * fVar23 - fVar24 * fVar32);
    pbVar12[lVar15 + 2] = fVar28 * fVar24 - (float)local_190 * fVar26;
    pbVar12 = info->m_J2angularAxis;
    lVar14 = 0;
    do {
      pbVar12[lVar15 + lVar14] = -*(btScalar *)(local_148 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    fVar24 = fVar26 * fVar39 + -fVar32 * fVar33;
    fVar32 = fVar32 * fVar29 + -fVar28 * fVar39;
    bVar45 = fVar28 * fVar33 + -fVar26 * fVar29;
    fVar30 = local_68 * fVar39 + -fStack_64 * fVar33;
    fVar46 = fStack_64 * fVar29 + -fVar44 * fVar39;
    fVar34 = fVar44 * fVar33 + -local_68 * fVar29;
    local_148._4_4_ = fVar46;
    local_148._0_4_ = fVar30;
    local_148._8_4_ = fVar34;
    local_148._12_4_ = 0;
    if ((((auVar35 | auVar9) & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (this->m_solveAngLim == true)) {
      local_148._4_4_ = (float)local_d8._4_4_ * fVar46;
      local_148._0_4_ = (float)local_d8._0_4_ * fVar30;
      local_148._8_4_ = fVar34 * fVar38;
      local_148._12_4_ = 0;
      fVar24 = fVar24 * (float)local_c8._0_4_;
      fVar32 = fVar32 * (float)local_c8._4_4_;
      bVar45 = bVar45 * local_128;
    }
    pbVar12 = info->m_J1angularAxis;
    *(ulong *)(pbVar12 + lVar18) = CONCAT44(fVar32,fVar24);
    pbVar12[lVar18 + 2] = bVar45;
    pbVar12 = info->m_J2angularAxis;
    lVar14 = 0;
    do {
      pbVar12[lVar18 + lVar14] = -*(btScalar *)(local_148 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    pbVar12 = info->m_J1linearAxis;
    pbVar12[lVar15 + 2] = fVar23;
    *(ulong *)(pbVar12 + lVar15) = _local_190;
    pbVar12[lVar18 + 2] = fVar39;
    *(ulong *)(pbVar12 + lVar18) = CONCAT44(fVar33,fVar29);
    pbVar12 = info->m_J2linearAxis;
    lVar14 = 0;
    do {
      pbVar12[lVar15 + lVar14] = -*(btScalar *)(local_190 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    pbVar12 = info->m_J2linearAxis;
    lVar14 = 0;
    do {
      pbVar12[lVar18 + lVar14] = -*(btScalar *)(local_178 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    fVar24 = 0.0;
    fVar23 = 0.0;
    fVar29 = 0.0;
    fVar39 = local_68;
  }
  else {
    fVar24 = fVar24 - fVar44;
    fVar23 = fVar23 - fVar26;
    fVar29 = fVar29 - fVar30;
    local_78._4_4_ = (float)local_190 * fVar29 - fVar33 * fVar24;
    local_78._0_4_ = fVar33 * fVar23 - fVar32 * fVar29;
    local_78._8_4_ = fVar24 * fVar32 - (float)local_190 * fVar23;
    local_78._12_4_ = 0;
    lVar14 = 0;
    do {
      pbVar12[lVar15 + lVar14] = *(float *)(local_78 + lVar14 * 4) * local_128;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    lVar14 = 0;
    do {
      pbVar17[lVar15 + lVar14] = *(float *)(local_78 + lVar14 * 4) * fVar38;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    local_78._4_4_ = (float)local_178._0_4_ * fVar29 + -fVar24 * fVar27;
    local_78._0_4_ = fVar27 * fVar23 + -fVar29 * fVar28;
    local_78._8_4_ = fVar24 * fVar28 + -fVar23 * (float)local_178._0_4_;
    local_78._12_4_ = 0;
    lVar14 = 0;
    do {
      pbVar12[lVar18 + lVar14] = *(float *)(local_78 + lVar14 * 4) * local_128;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    lVar14 = 0;
    do {
      pbVar17[lVar18 + lVar14] = *(float *)(local_78 + lVar14 * 4) * fVar38;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    pbVar12 = info->m_J1linearAxis;
    pbVar12[lVar15 + 2] = fVar33;
    *(ulong *)(pbVar12 + lVar15) = _local_190;
    pbVar12[lVar18 + 2] = fVar27;
    *(undefined1 (*) [8])(pbVar12 + lVar18) = local_178;
    pbVar12 = info->m_J2linearAxis;
    lVar14 = 0;
    do {
      pbVar12[lVar15 + lVar14] = -*(btScalar *)(local_190 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    pbVar12 = info->m_J2linearAxis;
    lVar14 = 0;
    do {
      pbVar12[lVar18 + lVar14] = -*(btScalar *)(local_178 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    fVar44 = 0.0;
    fVar39 = 0.0;
    fVar28 = 0.0;
    fVar26 = 0.0;
    _local_158 = ZEXT816(0);
    fVar27 = 0.0;
  }
  uVar19 = this->m_flags;
  fVar32 = this->m_softnessOrthoLin;
  if ((uVar19 & 0x20) == 0) {
    fVar32 = fVar32 * info->erp;
  }
  fVar32 = fVar32 * info->fps;
  pbVar12 = info->m_constraintError;
  pbVar12[lVar15] =
       (uStack_18c._4_4_ * local_180 + (float)local_190 * local_17c + (float)uStack_18c * local_ec)
       * fVar32;
  pbVar12[lVar18] =
       (local_180 * fStack_170 +
       local_17c * (float)local_178._0_4_ + local_ec * (float)local_178._4_4_) * fVar32;
  if ((uVar19 & 0x10) != 0) {
    pbVar17 = info->cfm;
    pbVar17[lVar15] = this->m_cfmOrthoLin;
    pbVar17[lVar18] = this->m_cfmOrthoLin;
  }
  fVar32 = (this->m_depth).m_floats[0] * fVar31;
  bVar3 = this->m_solveLinLim;
  cVar13 = (0.0 < fVar32) + '\x01';
  if (bVar3 == false) {
    fVar32 = 0.0;
    cVar13 = '\0';
  }
  bVar4 = this->m_poweredLinMotor;
  uVar20 = 4;
  if ((bVar4 | bVar3) == 1) {
    lVar15 = (long)info->rowskip;
    iVar16 = info->rowskip * 4;
    pbVar17 = info->m_J1linearAxis;
    iVar21 = iVar16 + 1;
    *(ulong *)(pbVar17 + lVar15 * 4) = CONCAT44(fStack_164,local_168);
    iVar16 = iVar16 + 2;
    pbVar17[iVar16] = (btScalar)local_138._0_4_;
    pbVar17 = info->m_J2linearAxis;
    *(ulong *)(pbVar17 + lVar15 * 4) = CONCAT44(fStack_164,local_168) ^ 0x8000000080000000;
    pbVar17[iVar16] = -(float)local_138._0_4_;
    if (this->m_useOffsetForConstraintFrame == true) {
      if (((auVar35 | auVar9) & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar24 = fStack_164 * fVar44 - local_168 * fVar39;
        uVar8 = CONCAT44((float)local_158._0_4_ * local_168 - (float)local_138._0_4_ * fVar44,
                         fVar39 * (float)local_138._0_4_ - fStack_164 * (float)local_158._0_4_);
        local_148._8_4_ = fVar24;
        local_148._0_8_ = uVar8;
        local_148._12_4_ = 0;
        pbVar17 = info->m_J1angularAxis;
        pbVar17[lVar15 * 4] = fVar26 * (float)local_138._0_4_ - fStack_164 * fVar27;
        *(ulong *)(pbVar17 + iVar21) =
             CONCAT44(fVar28 * fStack_164 - local_168 * fVar26,
                      fVar27 * local_168 - (float)local_138._0_4_ * fVar28);
        pbVar17 = info->m_J2angularAxis;
        *(ulong *)(pbVar17 + lVar15 * 4) = uVar8 ^ 0x8000000080000000;
        bVar45 = -fVar24;
        goto LAB_001a9857;
      }
    }
    else {
      fVar39 = fVar23 * (float)local_138._0_4_ - fStack_164 * fVar29;
      pbVar17 = info->m_J1angularAxis;
      pbVar17[lVar15 * 4] = local_128 * fVar39;
      fVar44 = fVar29 * local_168 - (float)local_138._0_4_ * fVar24;
      fVar24 = fVar24 * fStack_164 - local_168 * fVar23;
      *(ulong *)(pbVar17 + iVar21) = CONCAT44(local_128 * fVar24,local_128 * fVar44);
      pbVar17 = info->m_J2angularAxis;
      pbVar17[lVar15 * 4] = fVar39 * fVar38;
      pbVar17[iVar21] = fVar38 * fVar44;
      bVar45 = fVar24 * fVar38;
LAB_001a9857:
      pbVar17[iVar16] = bVar45;
    }
    fVar39 = this->m_lowerLinLimit;
    local_17c = this->m_upperLinLimit;
    pbVar12[lVar15 * 4] = 0.0;
    info->m_lowerLimit[lVar15 * 4] = 0.0;
    info->m_upperLimit[lVar15 * 4] = 0.0;
    pbVar12 = &info->erp;
    if ((uVar19 >> 9 & 1) != 0) {
      pbVar12 = &this->m_softnessLimLin;
    }
    local_180 = *pbVar12;
    local_128 = fVar32;
    if ((bVar4 != false) && ((fVar39 == local_17c & bVar3) == 0)) {
      local_158._0_4_ = fVar39;
      if ((uVar19 & 1) != 0) {
        info->cfm[lVar15 * 4] = this->m_cfmDirLin;
      }
      bVar45 = btTypedConstraint::getMotorFactor
                         (&this->super_btTypedConstraint,this->m_linPos,this->m_lowerLinLimit,
                          this->m_upperLinLimit,this->m_targetLinMotorVelocity,info->fps * local_180
                         );
      info->m_constraintError[lVar15 * 4] =
           info->m_constraintError[lVar15 * 4] - bVar45 * fVar31 * this->m_targetLinMotorVelocity;
      info->m_lowerLimit[lVar15 * 4] =
           info->m_lowerLimit[lVar15 * 4] - this->m_maxLinMotorForce / info->fps;
      info->m_upperLimit[lVar15 * 4] =
           this->m_maxLinMotorForce / info->fps + info->m_upperLimit[lVar15 * 4];
      fVar39 = (float)local_158._0_4_;
    }
    uVar20 = 5;
    if (bVar3 != false) {
      pbVar12 = info->m_constraintError;
      pbVar12[lVar15 * 4] = local_180 * info->fps * local_128 + pbVar12[lVar15 * 4];
      if ((this->m_flags & 0x100) != 0) {
        info->cfm[lVar15 * 4] = this->m_cfmLimLin;
      }
      if ((fVar39 != local_17c) || (NAN(fVar39) || NAN(local_17c))) {
        if (cVar13 != '\x01') {
          info->m_lowerLimit[lVar15 * 4] = 0.0;
          goto LAB_001a9a29;
        }
        info->m_lowerLimit[lVar15 * 4] = -3.4028235e+38;
        bVar45 = 0.0;
      }
      else {
        info->m_lowerLimit[lVar15 * 4] = -3.4028235e+38;
LAB_001a9a29:
        bVar45 = 3.4028235e+38;
      }
      info->m_upperLimit[lVar15 * 4] = bVar45;
      fVar39 = 1.0 - this->m_dampingLimLin;
      if (fVar39 != 0.0) {
        fVar39 = ABS(fVar39);
        fVar31 = fVar31 * ((local_40->m_floats[2] * (float)local_138._0_4_ +
                           local_40->m_floats[0] * local_168 + local_40->m_floats[1] * fStack_164) -
                          (local_38->m_floats[2] * (float)local_138._0_4_ +
                          local_38->m_floats[0] * local_168 + fStack_164 * local_38->m_floats[1]));
        if (cVar13 == '\x01') {
          if ((fVar31 < 0.0) &&
             (bVar45 = fVar31 * -fVar39,
             pbVar12[lVar15 * 4] <= bVar45 && bVar45 != pbVar12[lVar15 * 4])) {
LAB_001a9b05:
            pbVar12[lVar15 * 4] = bVar45;
          }
        }
        else if ((0.0 < fVar31) && (bVar45 = fVar31 * -fVar39, bVar45 < pbVar12[lVar15 * 4]))
        goto LAB_001a9b05;
      }
      pbVar12[lVar15 * 4] = this->m_softnessLimLin * pbVar12[lVar15 * 4];
    }
  }
  bVar3 = this->m_solveAngLim;
  local_128 = this->m_angDepth;
  bVar45 = local_128;
  if (bVar3 == false) {
    bVar45 = 0.0;
  }
  bVar4 = this->m_poweredAngMotor;
  if ((bVar4 | bVar3) != 1) {
    return;
  }
  lVar15 = (ulong)uVar20 * (long)info->rowskip;
  pbVar12 = info->m_J1angularAxis;
  *(ulong *)(pbVar12 + lVar15) = CONCAT44(fStack_164,local_168);
  pbVar12[(long)(int)lVar15 + 2] = (btScalar)local_138._0_4_;
  pbVar12 = info->m_J2angularAxis;
  *(ulong *)(pbVar12 + lVar15) = CONCAT44(fStack_164,local_168) ^ 0x8000000080000000;
  pbVar12[(long)(int)lVar15 + 2] = -(float)local_138._0_4_;
  fVar39 = this->m_lowerAngLimit;
  local_17c = this->m_upperAngLimit;
  pbVar12 = &info->erp;
  if (((uint)this->m_flags >> 0xb & 1) != 0) {
    pbVar12 = &this->m_softnessLimAng;
  }
  local_180 = *pbVar12;
  if ((bVar4 != false) && ((fVar39 == local_17c & bVar3) == 0)) {
    local_158._0_4_ = fVar39;
    if ((this->m_flags & 4U) != 0) {
      info->cfm[lVar15] = this->m_cfmDirAng;
    }
    bVar25 = btTypedConstraint::getMotorFactor
                       (&this->super_btTypedConstraint,this->m_angPos,this->m_lowerAngLimit,
                        this->m_upperAngLimit,this->m_targetAngMotorVelocity,info->fps * local_180);
    info->m_constraintError[lVar15] = bVar25 * this->m_targetAngMotorVelocity;
    info->m_lowerLimit[lVar15] = -this->m_maxAngMotorForce / info->fps;
    info->m_upperLimit[lVar15] = this->m_maxAngMotorForce / info->fps;
    fVar39 = (float)local_158._0_4_;
  }
  if (bVar3 == false) {
    return;
  }
  pbVar12 = info->m_constraintError;
  pbVar12[lVar15] = local_180 * info->fps * bVar45 + pbVar12[lVar15];
  if ((this->m_flags & 0x400) != 0) {
    info->cfm[lVar15] = this->m_cfmLimAng;
  }
  if ((fVar39 != local_17c) || (NAN(fVar39) || NAN(local_17c))) {
    if ((bVar3 != false) && (0.0 < local_128)) {
      info->m_lowerLimit[lVar15] = 0.0;
      goto LAB_001a9d22;
    }
    info->m_lowerLimit[lVar15] = -3.4028235e+38;
    bVar45 = 0.0;
  }
  else {
    info->m_lowerLimit[lVar15] = -3.4028235e+38;
LAB_001a9d22:
    bVar45 = 3.4028235e+38;
  }
  info->m_upperLimit[lVar15] = bVar45;
  fVar39 = 1.0 - this->m_dampingLimAng;
  if (fVar39 != 0.0) {
    fVar39 = ABS(fVar39);
    pbVar6 = (this->super_btTypedConstraint).m_rbA;
    pbVar7 = (this->super_btTypedConstraint).m_rbB;
    fVar31 = ((pbVar6->m_angularVelocity).m_floats[2] * (float)local_138._0_4_ +
             (pbVar6->m_angularVelocity).m_floats[0] * local_168 +
             (pbVar6->m_angularVelocity).m_floats[1] * fStack_164) -
             ((pbVar7->m_angularVelocity).m_floats[2] * (float)local_138._0_4_ +
             local_168 * (pbVar7->m_angularVelocity).m_floats[0] +
             fStack_164 * (pbVar7->m_angularVelocity).m_floats[1]);
    if ((bVar3 == false) || (local_128 <= 0.0)) {
      if ((fVar31 <= 0.0) || (bVar45 = fVar31 * -fVar39, pbVar12[lVar15] <= bVar45))
      goto LAB_001a9e0c;
    }
    else if ((0.0 <= fVar31) ||
            (bVar45 = fVar31 * -fVar39, bVar45 < pbVar12[lVar15] || bVar45 == pbVar12[lVar15]))
    goto LAB_001a9e0c;
    pbVar12[lVar15] = bVar45;
  }
LAB_001a9e0c:
  pbVar12[lVar15] = this->m_softnessLimAng * pbVar12[lVar15];
  return;
}

Assistant:

void btSliderConstraint::getInfo2NonVirtual(btConstraintInfo2* info, const btTransform& transA,const btTransform& transB, const btVector3& linVelA,const btVector3& linVelB, btScalar rbAinvMass,btScalar rbBinvMass  )
{
	const btTransform& trA = getCalculatedTransformA();
	const btTransform& trB = getCalculatedTransformB();
	
	btAssert(!m_useSolveConstraintObsolete);
	int i, s = info->rowskip;
	
	btScalar signFact = m_useLinearReferenceFrameA ? btScalar(1.0f) : btScalar(-1.0f);
	
	// difference between frames in WCS
	btVector3 ofs = trB.getOrigin() - trA.getOrigin();
	// now get weight factors depending on masses
	btScalar miA = rbAinvMass;
	btScalar miB = rbBinvMass;
	bool hasStaticBody = (miA < SIMD_EPSILON) || (miB < SIMD_EPSILON);
	btScalar miS = miA + miB;
	btScalar factA, factB;
	if(miS > btScalar(0.f))
	{
		factA = miB / miS;
	}
	else 
	{
		factA = btScalar(0.5f);
	}
	factB = btScalar(1.0f) - factA;
	btVector3 ax1, p, q;
	btVector3 ax1A = trA.getBasis().getColumn(0);
	btVector3 ax1B = trB.getBasis().getColumn(0);
	if(m_useOffsetForConstraintFrame)
	{
		// get the desired direction of slider axis
		// as weighted sum of X-orthos of frameA and frameB in WCS
		ax1 = ax1A * factA + ax1B * factB;
		ax1.normalize();
		// construct two orthos to slider axis
		btPlaneSpace1 (ax1, p, q);
	}
	else
	{ // old way - use frameA
		ax1 = trA.getBasis().getColumn(0);
		// get 2 orthos to slider axis (Y, Z)
		p = trA.getBasis().getColumn(1);
		q = trA.getBasis().getColumn(2);
	}
	// make rotations around these orthos equal
	// the slider axis should be the only unconstrained
	// rotational axis, the angular velocity of the two bodies perpendicular to
	// the slider axis should be equal. thus the constraint equations are
	//    p*w1 - p*w2 = 0
	//    q*w1 - q*w2 = 0
	// where p and q are unit vectors normal to the slider axis, and w1 and w2
	// are the angular velocity vectors of the two bodies.
	info->m_J1angularAxis[0] = p[0];
	info->m_J1angularAxis[1] = p[1];
	info->m_J1angularAxis[2] = p[2];
	info->m_J1angularAxis[s+0] = q[0];
	info->m_J1angularAxis[s+1] = q[1];
	info->m_J1angularAxis[s+2] = q[2];

	info->m_J2angularAxis[0] = -p[0];
	info->m_J2angularAxis[1] = -p[1];
	info->m_J2angularAxis[2] = -p[2];
	info->m_J2angularAxis[s+0] = -q[0];
	info->m_J2angularAxis[s+1] = -q[1];
	info->m_J2angularAxis[s+2] = -q[2];
	// compute the right hand side of the constraint equation. set relative
	// body velocities along p and q to bring the slider back into alignment.
	// if ax1A,ax1B are the unit length slider axes as computed from bodyA and
	// bodyB, we need to rotate both bodies along the axis u = (ax1 x ax2).
	// if "theta" is the angle between ax1 and ax2, we need an angular velocity
	// along u to cover angle erp*theta in one step :
	//   |angular_velocity| = angle/time = erp*theta / stepsize
	//                      = (erp*fps) * theta
	//    angular_velocity  = |angular_velocity| * (ax1 x ax2) / |ax1 x ax2|
	//                      = (erp*fps) * theta * (ax1 x ax2) / sin(theta)
	// ...as ax1 and ax2 are unit length. if theta is smallish,
	// theta ~= sin(theta), so
	//    angular_velocity  = (erp*fps) * (ax1 x ax2)
	// ax1 x ax2 is in the plane space of ax1, so we project the angular
	// velocity to p and q to find the right hand side.
//	btScalar k = info->fps * info->erp * getSoftnessOrthoAng();
	btScalar currERP = (m_flags & BT_SLIDER_FLAGS_ERP_ORTANG) ? m_softnessOrthoAng : m_softnessOrthoAng * info->erp;
	btScalar k = info->fps * currERP;

	btVector3 u = ax1A.cross(ax1B);
	info->m_constraintError[0] = k * u.dot(p);
	info->m_constraintError[s] = k * u.dot(q);
	if(m_flags & BT_SLIDER_FLAGS_CFM_ORTANG)
	{
		info->cfm[0] = m_cfmOrthoAng;
		info->cfm[s] = m_cfmOrthoAng;
	}

	int nrow = 1; // last filled row
	int srow;
	btScalar limit_err;
	int limit;
	int powered;

	// next two rows. 
	// we want: velA + wA x relA == velB + wB x relB ... but this would
	// result in three equations, so we project along two orthos to the slider axis

	btTransform bodyA_trans = transA;
	btTransform bodyB_trans = transB;
	nrow++;
	int s2 = nrow * s;
	nrow++;
	int s3 = nrow * s;
	btVector3 tmpA(0,0,0), tmpB(0,0,0), relA(0,0,0), relB(0,0,0), c(0,0,0);
	if(m_useOffsetForConstraintFrame)
	{
		// get vector from bodyB to frameB in WCS
		relB = trB.getOrigin() - bodyB_trans.getOrigin();
		// get its projection to slider axis
		btVector3 projB = ax1 * relB.dot(ax1);
		// get vector directed from bodyB to slider axis (and orthogonal to it)
		btVector3 orthoB = relB - projB;
		// same for bodyA
		relA = trA.getOrigin() - bodyA_trans.getOrigin();
		btVector3 projA = ax1 * relA.dot(ax1);
		btVector3 orthoA = relA - projA;
		// get desired offset between frames A and B along slider axis
		btScalar sliderOffs = m_linPos - m_depth[0];
		// desired vector from projection of center of bodyA to projection of center of bodyB to slider axis
		btVector3 totalDist = projA + ax1 * sliderOffs - projB;
		// get offset vectors relA and relB
		relA = orthoA + totalDist * factA;
		relB = orthoB - totalDist * factB;
		// now choose average ortho to slider axis
		p = orthoB * factA + orthoA * factB;
		btScalar len2 = p.length2();
		if(len2 > SIMD_EPSILON)
		{
			p /= btSqrt(len2);
		}
		else
		{
			p = trA.getBasis().getColumn(1);
		}
		// make one more ortho
		q = ax1.cross(p);
		// fill two rows
		tmpA = relA.cross(p);
		tmpB = relB.cross(p);
		for (i=0; i<3; i++) info->m_J1angularAxis[s2+i] = tmpA[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s2+i] = -tmpB[i];
		tmpA = relA.cross(q);
		tmpB = relB.cross(q);
		if(hasStaticBody && getSolveAngLimit())
		{ // to make constraint between static and dynamic objects more rigid
			// remove wA (or wB) from equation if angular limit is hit
			tmpB *= factB;
			tmpA *= factA;
		}
		for (i=0; i<3; i++) info->m_J1angularAxis[s3+i] = tmpA[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s3+i] = -tmpB[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s2+i] = p[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s3+i] = q[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s2+i] = -p[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s3+i] = -q[i];
	}
	else
	{	// old way - maybe incorrect if bodies are not on the slider axis
		// see discussion "Bug in slider constraint" http://bulletphysics.org/Bullet/phpBB3/viewtopic.php?f=9&t=4024&start=0
		c = bodyB_trans.getOrigin() - bodyA_trans.getOrigin();
		btVector3 tmp = c.cross(p);
		for (i=0; i<3; i++) info->m_J1angularAxis[s2+i] = factA*tmp[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s2+i] = factB*tmp[i];
		tmp = c.cross(q);
		for (i=0; i<3; i++) info->m_J1angularAxis[s3+i] = factA*tmp[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s3+i] = factB*tmp[i];

		for (i=0; i<3; i++) info->m_J1linearAxis[s2+i] = p[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s3+i] = q[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s2+i] = -p[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s3+i] = -q[i];
	}
	// compute two elements of right hand side

	//	k = info->fps * info->erp * getSoftnessOrthoLin();
	currERP = (m_flags & BT_SLIDER_FLAGS_ERP_ORTLIN) ? m_softnessOrthoLin : m_softnessOrthoLin * info->erp;
	k = info->fps * currERP;

	btScalar rhs = k * p.dot(ofs);
	info->m_constraintError[s2] = rhs;
	rhs = k * q.dot(ofs);
	info->m_constraintError[s3] = rhs;
	if(m_flags & BT_SLIDER_FLAGS_CFM_ORTLIN)
	{
		info->cfm[s2] = m_cfmOrthoLin;
		info->cfm[s3] = m_cfmOrthoLin;
	}


	// check linear limits
	limit_err = btScalar(0.0);
	limit = 0;
	if(getSolveLinLimit())
	{
		limit_err = getLinDepth() *  signFact;
		limit = (limit_err > btScalar(0.0)) ? 2 : 1;
	}
	powered = 0;
	if(getPoweredLinMotor())
	{
		powered = 1;
	}
	// if the slider has joint limits or motor, add in the extra row
	if (limit || powered) 
	{
		nrow++;
		srow = nrow * info->rowskip;
		info->m_J1linearAxis[srow+0] = ax1[0];
		info->m_J1linearAxis[srow+1] = ax1[1];
		info->m_J1linearAxis[srow+2] = ax1[2];
		info->m_J2linearAxis[srow+0] = -ax1[0];
		info->m_J2linearAxis[srow+1] = -ax1[1];
		info->m_J2linearAxis[srow+2] = -ax1[2];
		// linear torque decoupling step:
		//
		// we have to be careful that the linear constraint forces (+/- ax1) applied to the two bodies
		// do not create a torque couple. in other words, the points that the
		// constraint force is applied at must lie along the same ax1 axis.
		// a torque couple will result in limited slider-jointed free
		// bodies from gaining angular momentum.
		if(m_useOffsetForConstraintFrame)
		{
			// this is needed only when bodyA and bodyB are both dynamic.
			if(!hasStaticBody)
			{
				tmpA = relA.cross(ax1);
				tmpB = relB.cross(ax1);
				info->m_J1angularAxis[srow+0] = tmpA[0];
				info->m_J1angularAxis[srow+1] = tmpA[1];
				info->m_J1angularAxis[srow+2] = tmpA[2];
				info->m_J2angularAxis[srow+0] = -tmpB[0];
				info->m_J2angularAxis[srow+1] = -tmpB[1];
				info->m_J2angularAxis[srow+2] = -tmpB[2];
			}
		}
		else
		{ // The old way. May be incorrect if bodies are not on the slider axis
			btVector3 ltd;	// Linear Torque Decoupling vector (a torque)
			ltd = c.cross(ax1);
			info->m_J1angularAxis[srow+0] = factA*ltd[0];
			info->m_J1angularAxis[srow+1] = factA*ltd[1];
			info->m_J1angularAxis[srow+2] = factA*ltd[2];
			info->m_J2angularAxis[srow+0] = factB*ltd[0];
			info->m_J2angularAxis[srow+1] = factB*ltd[1];
			info->m_J2angularAxis[srow+2] = factB*ltd[2];
		}
		// right-hand part
		btScalar lostop = getLowerLinLimit();
		btScalar histop = getUpperLinLimit();
		if(limit && (lostop == histop))
		{  // the joint motor is ineffective
			powered = 0;
		}
		info->m_constraintError[srow] = 0.;
		info->m_lowerLimit[srow] = 0.;
		info->m_upperLimit[srow] = 0.;
		currERP = (m_flags & BT_SLIDER_FLAGS_ERP_LIMLIN) ? m_softnessLimLin : info->erp;
		if(powered)
		{
			if(m_flags & BT_SLIDER_FLAGS_CFM_DIRLIN)
			{
				info->cfm[srow] = m_cfmDirLin;
			}
			btScalar tag_vel = getTargetLinMotorVelocity();
			btScalar mot_fact = getMotorFactor(m_linPos, m_lowerLinLimit, m_upperLinLimit, tag_vel, info->fps * currERP);
			info->m_constraintError[srow] -= signFact * mot_fact * getTargetLinMotorVelocity();
			info->m_lowerLimit[srow] += -getMaxLinMotorForce() / info->fps;
			info->m_upperLimit[srow] += getMaxLinMotorForce() / info->fps;
		}
		if(limit)
		{
			k = info->fps * currERP;
			info->m_constraintError[srow] += k * limit_err;
			if(m_flags & BT_SLIDER_FLAGS_CFM_LIMLIN)
			{
				info->cfm[srow] = m_cfmLimLin;
			}
			if(lostop == histop) 
			{	// limited low and high simultaneously
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else if(limit == 1) 
			{ // low limit
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			}
			else 
			{ // high limit
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			// bounce (we'll use slider parameter abs(1.0 - m_dampingLimLin) for that)
			btScalar bounce = btFabs(btScalar(1.0) - getDampingLimLin());
			if(bounce > btScalar(0.0))
			{
				btScalar vel = linVelA.dot(ax1);
				vel -= linVelB.dot(ax1);
				vel *= signFact;
				// only apply bounce if the velocity is incoming, and if the
				// resulting c[] exceeds what we already have.
				if(limit == 1)
				{	// low limit
					if(vel < 0)
					{
						btScalar newc = -bounce * vel;
						if (newc > info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
				else
				{ // high limit - all those computations are reversed
					if(vel > 0)
					{
						btScalar newc = -bounce * vel;
						if(newc < info->m_constraintError[srow]) 
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
			}
			info->m_constraintError[srow] *= getSoftnessLimLin();
		} // if(limit)
	} // if linear limit
	// check angular limits
	limit_err = btScalar(0.0);
	limit = 0;
	if(getSolveAngLimit())
	{
		limit_err = getAngDepth();
		limit = (limit_err > btScalar(0.0)) ? 1 : 2;
	}
	// if the slider has joint limits, add in the extra row
	powered = 0;
	if(getPoweredAngMotor())
	{
		powered = 1;
	}
	if(limit || powered) 
	{
		nrow++;
		srow = nrow * info->rowskip;
		info->m_J1angularAxis[srow+0] = ax1[0];
		info->m_J1angularAxis[srow+1] = ax1[1];
		info->m_J1angularAxis[srow+2] = ax1[2];

		info->m_J2angularAxis[srow+0] = -ax1[0];
		info->m_J2angularAxis[srow+1] = -ax1[1];
		info->m_J2angularAxis[srow+2] = -ax1[2];

		btScalar lostop = getLowerAngLimit();
		btScalar histop = getUpperAngLimit();
		if(limit && (lostop == histop))
		{  // the joint motor is ineffective
			powered = 0;
		}
		currERP = (m_flags & BT_SLIDER_FLAGS_ERP_LIMANG) ? m_softnessLimAng : info->erp;
		if(powered)
		{
			if(m_flags & BT_SLIDER_FLAGS_CFM_DIRANG)
			{
				info->cfm[srow] = m_cfmDirAng;
			}
			btScalar mot_fact = getMotorFactor(m_angPos, m_lowerAngLimit, m_upperAngLimit, getTargetAngMotorVelocity(), info->fps * currERP);
			info->m_constraintError[srow] = mot_fact * getTargetAngMotorVelocity();
			info->m_lowerLimit[srow] = -getMaxAngMotorForce() / info->fps;
			info->m_upperLimit[srow] = getMaxAngMotorForce() / info->fps;
		}
		if(limit)
		{
			k = info->fps * currERP;
			info->m_constraintError[srow] += k * limit_err;
			if(m_flags & BT_SLIDER_FLAGS_CFM_LIMANG)
			{
				info->cfm[srow] = m_cfmLimAng;
			}
			if(lostop == histop) 
			{
				// limited low and high simultaneously
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else if(limit == 1) 
			{ // low limit
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else 
			{ // high limit
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			}
			// bounce (we'll use slider parameter abs(1.0 - m_dampingLimAng) for that)
			btScalar bounce = btFabs(btScalar(1.0) - getDampingLimAng());
			if(bounce > btScalar(0.0))
			{
				btScalar vel = m_rbA.getAngularVelocity().dot(ax1);
				vel -= m_rbB.getAngularVelocity().dot(ax1);
				// only apply bounce if the velocity is incoming, and if the
				// resulting c[] exceeds what we already have.
				if(limit == 1)
				{	// low limit
					if(vel < 0)
					{
						btScalar newc = -bounce * vel;
						if(newc > info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
				else
				{	// high limit - all those computations are reversed
					if(vel > 0)
					{
						btScalar newc = -bounce * vel;
						if(newc < info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
			}
			info->m_constraintError[srow] *= getSoftnessLimAng();
		} // if(limit)
	} // if angular limit or powered
}